

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

void __thiscall QCss::Declaration::styleValues(Declaration *this,BorderStyle *s)

{
  undefined4 uVar1;
  BorderStyle BVar2;
  QList<QCss::Value> *this_00;
  DeclarationData *pDVar3;
  Promoted<long_long,_int> PVar4;
  undefined4 *in_RSI;
  long in_FS_OFFSET;
  int i;
  Value *in_stack_ffffffffffffffb8;
  int local_2c;
  int local_14;
  qsizetype local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_2c = 0;
  while( true ) {
    this_00 = (QList<QCss::Value> *)(long)local_2c;
    pDVar3 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                       ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2fe3e
                       );
    local_10 = QList<QCss::Value>::size(&pDVar3->values);
    local_14 = 4;
    PVar4 = qMin<long_long,int>(&local_10,&local_14);
    if (PVar4 <= (long)this_00) break;
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
              ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2fe7d);
    QList<QCss::Value>::at(this_00,(qsizetype)in_stack_ffffffffffffffb8);
    BVar2 = parseStyleValue(in_stack_ffffffffffffffb8);
    in_RSI[local_2c] = BVar2;
    local_2c = local_2c + 1;
  }
  if (local_2c == 0) {
    in_RSI[3] = 1;
    in_RSI[2] = 1;
    in_RSI[1] = 1;
    *in_RSI = 1;
  }
  else if (local_2c == 1) {
    uVar1 = *in_RSI;
    in_RSI[1] = uVar1;
    in_RSI[2] = uVar1;
    in_RSI[3] = uVar1;
  }
  else if (local_2c == 2) {
    in_RSI[2] = *in_RSI;
    in_RSI[3] = in_RSI[1];
  }
  else if (local_2c == 3) {
    in_RSI[3] = in_RSI[1];
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Declaration::styleValues(BorderStyle *s) const
{
    int i;
    for (i = 0; i < qMin(d->values.size(), 4); i++)
        s[i] = parseStyleValue(d->values.at(i));
    if (i == 0) s[0] = s[1] = s[2] = s[3] = BorderStyle_None;
    else if (i == 1) s[3] = s[2] = s[1] = s[0];
    else if (i == 2) s[2] = s[0], s[3] = s[1];
    else if (i == 3) s[3] = s[1];
}